

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

bool __thiscall AmpIO::SetMotorVoltageRatio(AmpIO *this,uint index,double ratio)

{
  uint uVar1;
  uint32_t uVar2;
  
  uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
  uVar1 = this->NumMotors;
  if (index < uVar1 && uVar2 == 0x64524131) {
    if ((this->collect_state == true) && (index + 1 == (uint)this->collect_chan)) {
      this->WriteBuffer[this->WB_CURR_OFFSET + index] =
           this->WriteBuffer[this->WB_CURR_OFFSET + index] | 0x40000000;
    }
    this->WriteBuffer[this->WB_CURR_OFFSET + index] =
         this->WriteBuffer[this->WB_CURR_OFFSET + index] | 0x80000000;
    this->WriteBuffer[this->WB_CURR_OFFSET + index] =
         this->WriteBuffer[this->WB_CURR_OFFSET + index] & 0xf0000000;
    this->WriteBuffer[this->WB_CURR_OFFSET + index] =
         this->WriteBuffer[this->WB_CURR_OFFSET + index] | 0x1000000;
    this->WriteBuffer[index + this->WB_CURR_OFFSET] =
         this->WriteBuffer[index + this->WB_CURR_OFFSET] | ((int)(ratio * 1023.0) & 0x7ffU) << 0xd;
  }
  return index < uVar1 && uVar2 == 0x64524131;
}

Assistant:

bool AmpIO::SetMotorVoltageRatio(unsigned int index, double ratio)
{
    if (GetHardwareVersion() != dRA1_String)
        return false;

    if (index < NumMotors) {
        if (collect_state && (collect_chan == (index+1))) {
            WriteBuffer[index+WB_CURR_OFFSET] |= COLLECT_BIT;
        }
        WriteBuffer[index+WB_CURR_OFFSET] |= VALID_BIT;
        WriteBuffer[index+WB_CURR_OFFSET] &= ~0x0FFFFFFF;
        WriteBuffer[index+WB_CURR_OFFSET] |= 1 << 24; // select voltage mode
        WriteBuffer[index+WB_CURR_OFFSET] |= ((int)(ratio * 1023) & 0b11111111111) << 13;
        return true;
    } else {
        return false;
    }
}